

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void __thiscall
testing::internal::
ElementsAreMatcherImpl<std::set<pstore::gsl::not_null<pstore::command_line::option_const*>,pstore::command_line::details::less_name,std::allocator<pstore::gsl::not_null<pstore::command_line::option_const*>>>const&>
::
ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<pstore::gsl::not_null<pstore::command_line::option_const*>const&>*,std::vector<testing::Matcher<pstore::gsl::not_null<pstore::command_line::option_const*>const&>,std::allocator<testing::Matcher<pstore::gsl::not_null<pstore::command_line::option_const*>const&>>>>>
          (ElementsAreMatcherImpl<std::set<pstore::gsl::not_null<pstore::command_line::option_const*>,pstore::command_line::details::less_name,std::allocator<pstore::gsl::not_null<pstore::command_line::option_const*>>>const&>
           *this,__normal_iterator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_*,_std::vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>_>
                 first,
          __normal_iterator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_*,_std::vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>_>
          last)

{
  MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&> MStack_38;
  
  *(undefined ***)this = &PTR__ElementsAreMatcherImpl_0019a1e8;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  for (; first._M_current != last._M_current; first._M_current = first._M_current + 1) {
    Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>::Matcher
              ((Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&> *)
               &MStack_38,first._M_current);
    std::
    vector<testing::Matcher<pstore::gsl::not_null<pstore::command_line::option_const*>const&>,std::allocator<testing::Matcher<pstore::gsl::not_null<pstore::command_line::option_const*>const&>>>
    ::
    emplace_back<testing::Matcher<pstore::gsl::not_null<pstore::command_line::option_const*>const&>>
              ((vector<testing::Matcher<pstore::gsl::not_null<pstore::command_line::option_const*>const&>,std::allocator<testing::Matcher<pstore::gsl::not_null<pstore::command_line::option_const*>const&>>>
                *)(this + 8),
               (Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&> *)
               &MStack_38);
    MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>::~MatcherBase
              (&MStack_38);
  }
  return;
}

Assistant:

ElementsAreMatcherImpl(InputIter first, InputIter last) {
    while (first != last) {
      matchers_.push_back(MatcherCast<const Element&>(*first++));
    }
  }